

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

void __thiscall TTD::TTEventList::Iterator::MoveNext(Iterator *this)

{
  size_t sVar1;
  EventLogEntry *pEVar2;
  size_t local_30;
  size_t dataSize;
  EventLogEntry *data;
  Iterator *this_local;
  
  pEVar2 = Current(this);
  sVar1 = this->m_vtable[pEVar2->EventKind].DataSize;
  if (this->m_currIdx + sVar1 < this->m_currLink->CurrPos) {
    this->m_currIdx = sVar1 + this->m_currIdx;
  }
  else {
    this->m_currLink = this->m_currLink->Next;
    if (this->m_currLink == (TTEventListLink *)0x0) {
      local_30 = 0;
    }
    else {
      local_30 = this->m_currLink->StartPos;
    }
    this->m_currIdx = local_30;
  }
  return;
}

Assistant:

void TTEventList::Iterator::MoveNext()
    {
        NSLogEvents::EventLogEntry* data = this->Current();
        size_t dataSize = this->m_vtable[(uint32)data->EventKind].DataSize;

        if(this->m_currIdx + dataSize < this->m_currLink->CurrPos)
        {
            this->m_currIdx += dataSize;
        }
        else
        {
            this->m_currLink = this->m_currLink->Next;
            this->m_currIdx = (this->m_currLink != nullptr) ? this->m_currLink->StartPos : 0;
        }
    }